

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  reference pvVar2;
  double dVar3;
  undefined4 uVar8;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  matrix<double,_remora::column_major,_remora::cpu_tag> Ccol;
  matrix<double,_remora::row_major,_remora::cpu_tag> Crow;
  matrix<double,_remora::column_major,_remora::cpu_tag> Bcol;
  matrix<double,_remora::column_major,_remora::cpu_tag> Acol;
  size_t j;
  size_t k_1;
  matrix<double,_remora::row_major,_remora::cpu_tag> Brow;
  size_t k;
  size_t i;
  matrix<double,_remora::row_major,_remora::cpu_tag> Arow;
  size_t middle;
  size_t iter;
  size_t size;
  ostream *in_stack_fffffffffffffdd0;
  double in_stack_fffffffffffffdd8;
  matrix<double,_remora::row_major,_remora::cpu_tag> *in_stack_fffffffffffffde0;
  ostream *in_stack_fffffffffffffde8;
  matrix<double,_remora::row_major,_remora::cpu_tag> *in_stack_fffffffffffffdf0;
  ostream *in_stack_fffffffffffffdf8;
  matrix<double,_remora::row_major,_remora::cpu_tag> *in_stack_fffffffffffffe00;
  ostream *in_stack_fffffffffffffe60;
  ostream *in_stack_fffffffffffffe68;
  matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_fffffffffffffe70;
  ulong local_a8;
  ulong local_a0;
  ulong local_60;
  ulong local_58;
  long local_20;
  ulong local_18;
  
  local_18 = 100;
  poVar1 = std::operator<<((ostream *)&std::cout,"Flops");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_20 = 0; local_20 != 5; local_20 = local_20 + 1) {
    remora::matrix<double,_remora::row_major,_remora::cpu_tag>::matrix
              (in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8,
               (size_type)in_stack_fffffffffffffde0);
    for (local_58 = 0; uVar8 = (undefined4)(local_18 >> 0x20), local_58 != local_18;
        local_58 = local_58 + 1) {
      for (local_60 = 0; local_60 != local_18; local_60 = local_60 + 1) {
        auVar4._8_4_ = uVar8;
        auVar4._0_8_ = local_18;
        auVar4._12_4_ = 0x45300000;
        dVar3 = 0.1 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0));
        auVar5._8_4_ = (int)(local_58 >> 0x20);
        auVar5._0_8_ = local_58;
        auVar5._12_4_ = 0x45300000;
        auVar9._8_4_ = (int)(local_60 >> 0x20);
        auVar9._0_8_ = local_60;
        auVar9._12_4_ = 0x45300000;
        pvVar2 = remora::matrix<double,_remora::row_major,_remora::cpu_tag>::operator()
                           (in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8,
                            (size_type)in_stack_fffffffffffffdd0);
        *pvVar2 = dVar3 * ((auVar5._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_58) - 4503599627370496.0)) +
                  dVar3 * ((auVar9._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_60) - 4503599627370496.0));
      }
    }
    remora::matrix<double,_remora::row_major,_remora::cpu_tag>::matrix
              (in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8,
               (size_type)in_stack_fffffffffffffde0);
    for (local_a0 = 0; local_a0 != local_18; local_a0 = local_a0 + 1) {
      for (local_a8 = 0; local_a8 != local_18; local_a8 = local_a8 + 1) {
        auVar6._8_4_ = uVar8;
        auVar6._0_8_ = local_18;
        auVar6._12_4_ = 0x45300000;
        dVar3 = 0.1 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0));
        auVar7._8_4_ = (int)(local_a8 >> 0x20);
        auVar7._0_8_ = local_a8;
        auVar7._12_4_ = 0x45300000;
        auVar10._8_4_ = (int)(local_a0 >> 0x20);
        auVar10._0_8_ = local_a0;
        auVar10._12_4_ = 0x45300000;
        pvVar2 = remora::matrix<double,_remora::row_major,_remora::cpu_tag>::operator()
                           (in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8,
                            (size_type)in_stack_fffffffffffffdd0);
        *pvVar2 = dVar3 * ((auVar7._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_a8) - 4503599627370496.0)) +
                  dVar3 * ((auVar10._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_a0) - 4503599627370496.0));
      }
    }
    remora::matrix<double,remora::column_major,remora::cpu_tag>::
    matrix<remora::matrix<double,remora::row_major,remora::cpu_tag>>
              ((matrix<double,_remora::column_major,_remora::cpu_tag> *)in_stack_fffffffffffffdf0,
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *)in_stack_fffffffffffffde8);
    remora::matrix<double,remora::column_major,remora::cpu_tag>::
    matrix<remora::matrix<double,remora::row_major,remora::cpu_tag>>
              ((matrix<double,_remora::column_major,_remora::cpu_tag> *)in_stack_fffffffffffffdf0,
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *)in_stack_fffffffffffffde8);
    remora::matrix<double,_remora::row_major,_remora::cpu_tag>::matrix
              (in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8,
               (size_type)in_stack_fffffffffffffdf0,(value_type *)in_stack_fffffffffffffde8);
    remora::matrix<double,_remora::column_major,_remora::cpu_tag>::matrix
              ((matrix<double,_remora::column_major,_remora::cpu_tag> *)in_stack_fffffffffffffe00,
               (size_type)in_stack_fffffffffffffdf8,(size_type)in_stack_fffffffffffffdf0,
               (value_type *)in_stack_fffffffffffffde8);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18);
    poVar1 = std::operator<<(poVar1,"\t row major results\t");
    in_stack_fffffffffffffe70 =
         (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
          *)benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe70,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe68,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe60);
    in_stack_fffffffffffffe68 =
         (ostream *)std::ostream::operator<<(poVar1,(double)in_stack_fffffffffffffe70);
    in_stack_fffffffffffffe60 = std::operator<<(in_stack_fffffffffffffe68,"\t");
    dVar3 = benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                      (in_stack_fffffffffffffe70,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe68,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe60);
    poVar1 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe60,dVar3);
    poVar1 = std::operator<<(poVar1,"\t");
    dVar3 = benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe70,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe68,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe60);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
    poVar1 = std::operator<<(poVar1,"\t");
    dVar3 = benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                      (in_stack_fffffffffffffe70,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe68,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe60);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18);
    poVar1 = std::operator<<(poVar1,"\t column major results\t");
    dVar3 = benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                      ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe70,
                       (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe68,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe60);
    in_stack_fffffffffffffe00 =
         (matrix<double,_remora::row_major,_remora::cpu_tag> *)
         std::ostream::operator<<(poVar1,dVar3);
    in_stack_fffffffffffffdf8 = std::operator<<((ostream *)in_stack_fffffffffffffe00,"\t");
    in_stack_fffffffffffffdf0 =
         (matrix<double,_remora::row_major,_remora::cpu_tag> *)
         benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                   (in_stack_fffffffffffffe70,
                    (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *)in_stack_fffffffffffffe68,
                    (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *)in_stack_fffffffffffffe60);
    in_stack_fffffffffffffde8 =
         (ostream *)
         std::ostream::operator<<(in_stack_fffffffffffffdf8,(double)in_stack_fffffffffffffdf0);
    in_stack_fffffffffffffde0 =
         (matrix<double,_remora::row_major,_remora::cpu_tag> *)
         std::operator<<(in_stack_fffffffffffffde8,"\t");
    in_stack_fffffffffffffdd8 =
         benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                   ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *)in_stack_fffffffffffffe70,
                    (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *)in_stack_fffffffffffffe68,
                    (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *)in_stack_fffffffffffffe60);
    in_stack_fffffffffffffdd0 =
         (ostream *)
         std::ostream::operator<<((ostream *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    poVar1 = std::operator<<(in_stack_fffffffffffffdd0,"\t");
    dVar3 = benchmark<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                      (in_stack_fffffffffffffe70,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe68,
                       (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *)in_stack_fffffffffffffe60);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_18 = local_18 << 1;
    remora::matrix<double,_remora::column_major,_remora::cpu_tag>::~matrix
              ((matrix<double,_remora::column_major,_remora::cpu_tag> *)0x10d9de);
    remora::matrix<double,_remora::row_major,_remora::cpu_tag>::~matrix
              ((matrix<double,_remora::row_major,_remora::cpu_tag> *)0x10d9eb);
    remora::matrix<double,_remora::column_major,_remora::cpu_tag>::~matrix
              ((matrix<double,_remora::column_major,_remora::cpu_tag> *)0x10d9f8);
    remora::matrix<double,_remora::column_major,_remora::cpu_tag>::~matrix
              ((matrix<double,_remora::column_major,_remora::cpu_tag> *)0x10da05);
    remora::matrix<double,_remora::row_major,_remora::cpu_tag>::~matrix
              ((matrix<double,_remora::row_major,_remora::cpu_tag> *)0x10da12);
    remora::matrix<double,_remora::row_major,_remora::cpu_tag>::~matrix
              ((matrix<double,_remora::row_major,_remora::cpu_tag> *)0x10da1f);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
	std::size_t size = 100;
	std::cout<<"Flops"<<std::endl;
	for(std::size_t iter = 0; iter != 5; ++iter){
		std::size_t middle = size;
		matrix<double,row_major> Arow(size,middle);
		for(std::size_t i = 0; i != size; ++i){
			for(std::size_t k = 0; k != middle; ++k){
				Arow(i,k)  = 0.1/size*i+0.1/size*k;
			}
		}

		matrix<double,row_major> Brow(middle,size);
		for(std::size_t k = 0; k != middle; ++k){
			for(std::size_t j = 0; j != size; ++j){
				Brow(k,j) = 0.1/size*j+0.1/size*k;
			}
		}
		matrix<double,column_major> Acol = Arow;
		matrix<double,column_major> Bcol = Brow;

		matrix<double,row_major> Crow(size,size,0.0);
		matrix<double,column_major> Ccol(size,size,0.0);
		std::cout<<size<<"\t row major results\t"<<benchmark(Arow,Brow,Crow)<<"\t"<< benchmark(Acol,Brow,Crow)
		<<"\t"<< benchmark(Arow,Bcol,Crow) <<"\t" <<benchmark(Acol,Bcol,Crow) <<std::endl;
		std::cout<<size<<"\t column major results\t"<<benchmark(Arow,Brow,Ccol)<<"\t"<< benchmark(Acol,Brow,Ccol)
		<<"\t"<< benchmark(Arow,Bcol,Ccol) <<"\t" <<benchmark(Acol,Bcol,Ccol) <<std::endl;
		size *=2;
	}
}